

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

optional<sub_bound_token> *
read_right_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  char *__s1;
  size_type __rlen;
  _Storage<double,_true> _Var4;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  optional<operator_token> oVar9;
  optional<double> oVar10;
  undefined1 auVar8 [56];
  
  auVar8 = in_ZMM0._8_56_;
  __s1 = buf_2._M_str;
  oVar9 = read_operator(buf_1,buf_2);
  if (((undefined1  [12])
       oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
       super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0) {
    if (oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
        super__Optional_payload_base<operator_token>._M_payload._4_4_ == 1) {
      if ((buf_2._M_len == 1) &&
         ((iVar3 = bcmp(__s1,"+",1), iVar3 == 0 || (iVar3 = bcmp(__s1,"-",1), iVar3 == 0)))) {
        iVar3 = bcmp(__s1,"-",1);
        oVar10 = read_real(buf_3);
        auVar6._0_8_ = oVar10.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_payload;
        auVar6._8_56_ = auVar8;
        if (((undefined1  [16])
             oVar10.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001353dd;
        auVar1._8_8_ = 0x8000000000000000;
        auVar1._0_8_ = 0x8000000000000000;
        auVar5 = vxorpd_avx512vl(auVar6._0_16_,auVar1);
        _Var4 = (_Storage<double,_true>)
                ((ulong)(iVar3 == 0) * auVar5._0_8_ + (ulong)(iVar3 != 0) * (long)auVar6._0_8_);
LAB_0013537f:
        iVar3 = 3;
      }
      else {
        oVar10 = read_real(buf_2);
        _Var4 = oVar10.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
        if (((undefined1  [16])
             oVar10.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_001353dd;
        iVar3 = 2;
      }
LAB_001353ce:
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_payload._M_value.value = (double)_Var4;
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_payload._M_value.read = iVar3;
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_payload._M_value.op =
           oVar9.super__Optional_base<operator_token,_true,_true>._M_payload.
           super__Optional_payload_base<operator_token>._M_payload._0_4_;
      bVar2 = true;
      goto LAB_001353df;
    }
    if ((buf_3._M_len == 1) &&
       ((iVar3 = bcmp(buf_3._M_str,"+",1), iVar3 == 0 ||
        (iVar3 = bcmp(buf_3._M_str,"-",1), iVar3 == 0)))) {
      iVar3 = bcmp(buf_3._M_str,"-",1);
      oVar10 = read_real(buf_4);
      auVar7._0_8_ = oVar10.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload;
      auVar7._8_56_ = auVar8;
      if (((undefined1  [16])
           oVar10.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar5._8_8_ = 0x8000000000000000;
        auVar5._0_8_ = 0x8000000000000000;
        auVar5 = vxorpd_avx512vl(auVar7._0_16_,auVar5);
        _Var4 = (_Storage<double,_true>)
                ((ulong)(iVar3 == 0) * auVar5._0_8_ + (ulong)(iVar3 != 0) * (long)auVar7._0_8_);
        iVar3 = 4;
        goto LAB_001353ce;
      }
    }
    else {
      oVar10 = read_real(buf_3);
      _Var4 = oVar10.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload;
      if (((undefined1  [16])
           oVar10.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0013537f;
    }
  }
LAB_001353dd:
  bVar2 = false;
LAB_001353df:
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_engaged = bVar2;
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_right_bound_token(const std::string_view buf_1,
                       const std::string_view buf_2,
                       const std::string_view buf_3,
                       const std::string_view buf_4) noexcept
{
    double negative = 1.0;
    baryonyx::operator_type op = baryonyx::operator_type::equal;

    if (auto operator_token = read_operator(buf_1, buf_2); operator_token) {
        op = operator_token->op;
        if (operator_token->read == 1) {
            if (buf_2 == "+" || buf_2 == "-") {
                if (buf_2 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_2); value_opt)
                    return sub_bound_token(negative * *value_opt, 2, op);
                else
                    return std::nullopt;
            }
        } else {
            if (buf_3 == "+" || buf_3 == "-") {
                if (buf_3 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_4); value_opt)
                    return sub_bound_token(negative * *value_opt, 4, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            }
        }
    } else
        return std::nullopt;
}